

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::testCaseEnded
          (CumulativeReporterBase *this,TestCaseStats *testCaseStats)

{
  TestCaseStats *pTVar1;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *pNVar2;
  size_type sVar3;
  type tVar4;
  SectionNode *pSVar5;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  local_20;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  node;
  TestCaseStats *testCaseStats_local;
  CumulativeReporterBase *this_local;
  
  node.m_p = (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *)testCaseStats
  ;
  pNVar2 = (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *)
           operator_new(0x1b8);
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::Node
            (pNVar2,(TestCaseStats *)node.m_p);
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  ::Ptr(&local_20,pNVar2);
  sVar3 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::size(&this->m_sectionStack);
  if (sVar3 != 0) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/tests/../3rd/catch/catch.hpp"
                  ,0x2269,
                  "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)"
                 );
  }
  pNVar2 = Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
           ::operator->(&local_20);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&pNVar2->children,&this->m_rootSection);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::push_back(&this->m_testCases,&local_20);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::reset(&this->m_rootSection);
  tVar4 = Catch::Ptr::operator_cast_to_function_pointer((Ptr *)&this->m_deepestSection);
  if (tVar4 != 0) {
    pTVar1 = &(node.m_p)->value;
    pSVar5 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator->(&this->m_deepestSection);
    std::__cxx11::string::operator=
              ((string *)&pSVar5->stdOut,(string *)&(pTVar1->totals).testCases.failed);
    pTVar1 = &(node.m_p)->value;
    pSVar5 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator->(&this->m_deepestSection);
    std::__cxx11::string::operator=
              ((string *)&pSVar5->stdErr,(string *)(pTVar1->stdOut).field_2._M_local_buf);
    Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
    ::~Ptr(&local_20);
    return;
  }
  __assert_fail("m_deepestSection",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/tests/../3rd/catch/catch.hpp"
                ,0x226e,
                "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)");
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) CATCH_OVERRIDE {
            Ptr<TestCaseNode> node = new TestCaseNode( testCaseStats );
            assert( m_sectionStack.size() == 0 );
            node->children.push_back( m_rootSection );
            m_testCases.push_back( node );
            m_rootSection.reset();

            assert( m_deepestSection );
            m_deepestSection->stdOut = testCaseStats.stdOut;
            m_deepestSection->stdErr = testCaseStats.stdErr;
        }